

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::setTextureSize
          (ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *this,uint32_t sizeX_,
          uint32_t sizeY_,uint32_t sizeZ_)

{
  allocator local_49;
  string local_48;
  
  if (this->deviceBufferType != Attribute) {
    std::__cxx11::string::string
              ((string *)&local_48,"managed buffer can only be set as texture once",&local_49);
    exception(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  this->deviceBufferType = Texture3d;
  this->sizeX = sizeX_;
  this->sizeY = sizeY_;
  this->sizeZ = sizeZ_;
  return;
}

Assistant:

void ManagedBuffer<T>::setTextureSize(uint32_t sizeX_, uint32_t sizeY_, uint32_t sizeZ_) {
  if (deviceBufferType != DeviceBufferType::Attribute) exception("managed buffer can only be set as texture once");

  deviceBufferType = DeviceBufferType::Texture3d;
  sizeX = sizeX_;
  sizeY = sizeY_;
  sizeZ = sizeZ_;
}